

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::UnaryScatter<duckdb::ProductState,double,duckdb::ProductFunction>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  double *pdVar2;
  byte *pbVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  char *pcVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  idx_t iVar15;
  idx_t iVar16;
  idx_t iVar17;
  ulong uVar18;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b0;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pdVar7 = input->data;
      pdVar8 = states->data;
      FlatVector::VerifyFlatVector(input);
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar15 = 0;
        do {
          pcVar6 = *(char **)(pdVar8 + iVar15 * 8);
          if (*pcVar6 == '\x01') {
            *pcVar6 = '\0';
          }
          *(double *)(pcVar6 + 8) = *(double *)(pdVar7 + iVar15 * 8) * *(double *)(pcVar6 + 8);
          iVar15 = iVar15 + 1;
        } while (count != iVar15);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar11 = 0;
      uVar13 = 0;
      do {
        uVar9 = puVar1[uVar11];
        uVar12 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar12 = count;
        }
        uVar14 = uVar12;
        if (uVar9 != 0) {
          uVar14 = uVar13;
          if (uVar9 == 0xffffffffffffffff) {
            if (uVar13 < uVar12) {
              do {
                pcVar6 = *(char **)(pdVar8 + uVar13 * 8);
                if (*pcVar6 == '\x01') {
                  *pcVar6 = '\0';
                }
                *(double *)(pcVar6 + 8) = *(double *)(pdVar7 + uVar13 * 8) * *(double *)(pcVar6 + 8)
                ;
                uVar13 = uVar13 + 1;
                uVar14 = uVar12;
              } while (uVar12 != uVar13);
            }
          }
          else if (uVar13 < uVar12) {
            uVar18 = 0;
            do {
              if ((uVar9 >> (uVar18 & 0x3f) & 1) != 0) {
                pcVar6 = *(char **)(pdVar8 + uVar18 * 8 + uVar13 * 8);
                if (*pcVar6 == '\x01') {
                  *pcVar6 = '\0';
                }
                *(double *)(pcVar6 + 8) =
                     *(double *)(pdVar7 + uVar18 * 8 + uVar13 * 8) * *(double *)(pcVar6 + 8);
              }
              uVar18 = uVar18 + 1;
              uVar14 = uVar12;
            } while (uVar12 - uVar13 != uVar18);
          }
        }
        uVar11 = uVar11 + 1;
        uVar13 = uVar14;
      } while (uVar11 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    if (count == 0) {
      return;
    }
    pdVar2 = (double *)input->data;
    pbVar3 = *(byte **)states->data;
    bVar10 = *pbVar3;
    do {
      if ((bVar10 & 1) != 0) {
        *pbVar3 = 0;
        bVar10 = 0;
      }
      *(double *)(pbVar3 + 8) = *pdVar2 * *(double *)(pbVar3 + 8);
      count = count - 1;
    } while (count != 0);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(input,count,&local_b0);
  Vector::ToUnifiedFormat(states,count,&local_68);
  if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = (local_b0.sel)->sel_vector;
      psVar5 = (local_68.sel)->sel_vector;
      iVar15 = 0;
      do {
        iVar16 = iVar15;
        if (psVar4 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar4[iVar15];
        }
        iVar17 = iVar15;
        if (psVar5 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar5[iVar15];
        }
        pcVar6 = *(char **)(local_68.data + iVar17 * 8);
        if (*pcVar6 == '\x01') {
          *pcVar6 = '\0';
        }
        *(double *)(pcVar6 + 8) = *(double *)(local_b0.data + iVar16 * 8) * *(double *)(pcVar6 + 8);
        iVar15 = iVar15 + 1;
      } while (count != iVar15);
    }
  }
  else if (count != 0) {
    psVar4 = (local_b0.sel)->sel_vector;
    psVar5 = (local_68.sel)->sel_vector;
    iVar15 = 0;
    do {
      iVar16 = iVar15;
      if (psVar4 != (sel_t *)0x0) {
        iVar16 = (idx_t)psVar4[iVar15];
      }
      iVar17 = iVar15;
      if (psVar5 != (sel_t *)0x0) {
        iVar17 = (idx_t)psVar5[iVar15];
      }
      if ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar16 >> 6]
           >> (iVar16 & 0x3f) & 1) != 0) {
        pcVar6 = *(char **)(local_68.data + iVar17 * 8);
        if (*pcVar6 == '\x01') {
          *pcVar6 = '\0';
        }
        *(double *)(pcVar6 + 8) = *(double *)(local_b0.data + iVar16 * 8) * *(double *)(pcVar6 + 8);
      }
      iVar15 = iVar15 + 1;
    } while (count != iVar15);
  }
  if (local_68.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}